

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

stack<c4::yml::Parser::State,_16UL> * __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::operator=
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  _cb(this,&that->m_callbacks);
  resize(this,that->m_size);
  _cp(this,that);
  return this;
}

Assistant:

stack& operator= (stack const& that) noexcept
    {
        _cb(that.m_callbacks);
        resize(that.m_size);
        _cp(&that);
        return *this;
    }